

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Encoding,_char> *b)

{
  Encoding EVar1;
  JSON<const_char_*,_char> local_30;
  char *local_20;
  char local_11;
  
  EVar1 = *b->object;
  switch(EVar1) {
  case DW_ATE_address:
    local_20 = "DW_ATE_address";
    break;
  case DW_ATE_boolean:
    local_20 = "DW_ATE_boolean";
    break;
  case DW_ATE_complex_float:
    local_20 = "DW_ATE_complex_float";
    break;
  case DW_ATE_float:
    local_20 = "DW_ATE_float";
    break;
  case DW_ATE_signed:
    local_20 = "DW_ATE_signed";
    break;
  case DW_ATE_signed_char:
    local_20 = "DW_ATE_signed_char";
    break;
  case DW_ATE_unsigned:
    local_20 = "DW_ATE_unsigned";
    break;
  case DW_ATE_unsigned_char:
    local_20 = "DW_ATE_unsigned_char";
    break;
  case DW_ATE_imaginary_float:
    local_20 = "DW_ATE_imaginary_float";
    break;
  case DW_ATE_packed_decimal:
    local_20 = "DW_ATE_packed_decimal";
    break;
  case DW_ATE_numeric_string:
    local_20 = "DW_ATE_numeric_string";
    break;
  case DW_ATE_edited:
    local_20 = "DW_ATE_edited";
    break;
  case DW_ATE_signed_fixed:
    local_20 = "DW_ATE_signed_fixed";
    break;
  case DW_ATE_unsigned_fixed:
    local_20 = "DW_ATE_unsigned_fixed";
    break;
  case DW_ATE_decimal_float:
    local_20 = "DW_ATE_decimal_float";
    break;
  case DW_ATE_UTF:
    local_20 = "DW_ATE_UTF";
    break;
  case DW_ATE_UCS:
    local_20 = "DW_ATE_UCS";
    break;
  case DW_ATE_ASCII:
    local_20 = "DW_ATE_ASCII";
    break;
  default:
    if (EVar1 == DW_ATE_lo_user) {
      local_20 = "DW_ATE_lo_user";
    }
    else {
      if (EVar1 != DW_ATE_hi_user) {
        std::ostream::operator<<(os,EVar1);
        return os;
      }
      local_20 = "DW_ATE_hi_user";
    }
  }
  local_11 = '\0';
  local_30.context = &local_11;
  local_30.object = &local_20;
  operator<<(os,&local_30);
  return os;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Encoding> &b)
{
#define DWARF_ATE(enc, val) case Dwarf::enc: os << json(#enc) ; break;

    switch (b.object) {
#include "libpstack/dwarf/encodings.h"
        default: os << int(b.object); break;
    }
    return os;
}